

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall
kj::Canceler::AdapterImpl<void>::AdapterImpl
          (AdapterImpl<void> *this,PromiseFulfiller<void> *fulfiller,Canceler *canceler,
          Promise<void> *inner)

{
  AdapterBase *pAVar1;
  PromiseNode *pPVar2;
  PromiseNode *pPVar3;
  Own<kj::_::EagerPromiseNode<kj::_::Void>_> OVar4;
  Own<kj::_::PromiseNode> local_48;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  (this->super_AdapterBase)._vptr_AdapterBase = (_func_int **)&PTR___cxa_pure_virtual_004488a8;
  (this->super_AdapterBase).prev.ptr = &canceler->list;
  (this->super_AdapterBase).next.ptr = (canceler->list).ptr;
  (canceler->list).ptr = &this->super_AdapterBase;
  pAVar1 = (this->super_AdapterBase).next.ptr;
  if (pAVar1 != (AdapterBase *)0x0) {
    (pAVar1->prev).ptr = &(this->super_AdapterBase).next;
  }
  (this->super_AdapterBase)._vptr_AdapterBase = (_func_int **)&PTR_cancel_004488c0;
  this->fulfiller = fulfiller;
  pPVar3 = (PromiseNode *)operator_new(0x30);
  pPVar3->_vptr_PromiseNode = (_func_int **)&PTR_onReady_00448988;
  pPVar3[1]._vptr_PromiseNode = (_func_int **)(inner->super_PromiseBase).node.disposer;
  pPVar2 = (inner->super_PromiseBase).node.ptr;
  pPVar3[2]._vptr_PromiseNode = (_func_int **)pPVar2;
  (inner->super_PromiseBase).node.ptr = (PromiseNode *)0x0;
  pPVar3[3]._vptr_PromiseNode =
       (_func_int **)
       _::
       TransformPromiseNode<kj::_::Void,_kj::_::Void,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++:146:11),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/async.c++:147:11)>
       ::anon_class_8_1_a7efefcd_for_func::operator();
  (*pPVar2->_vptr_PromiseNode[1])(pPVar2,pPVar3 + 1);
  pPVar3->_vptr_PromiseNode = (_func_int **)&PTR_onReady_00448e98;
  pPVar3[4]._vptr_PromiseNode = (_func_int **)fulfiller;
  pPVar3[5]._vptr_PromiseNode = (_func_int **)fulfiller;
  local_48.disposer =
       (Disposer *)
       &_::
        HeapDisposer<kj::_::TransformPromiseNode<kj::_::Void,kj::_::Void,kj::Canceler::AdapterImpl<void>::AdapterImpl(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::$_0,kj::Canceler::AdapterImpl<void>::$_0(kj::PromiseFulfiller<void>&,kj::Canceler&,kj::Promise<void>)::$_1>>
        ::instance;
  local_48.ptr = pPVar3;
  OVar4 = heap<kj::_::EagerPromiseNode<kj::_::Void>,kj::Own<kj::_::PromiseNode>>
                    ((kj *)&local_38,&local_48);
  pPVar2 = local_48.ptr;
  *(undefined4 *)&(this->inner).super_PromiseBase.node.disposer = local_38;
  *(undefined4 *)((long)&(this->inner).super_PromiseBase.node.disposer + 4) = uStack_34;
  *(undefined4 *)&(this->inner).super_PromiseBase.node.ptr = uStack_30;
  *(undefined4 *)((long)&(this->inner).super_PromiseBase.node.ptr + 4) = uStack_2c;
  if (local_48.ptr != (PromiseNode *)0x0) {
    local_48.ptr = (PromiseNode *)0x0;
    (**(local_48.disposer)->_vptr_Disposer)
              (local_48.disposer,pPVar2->_vptr_PromiseNode[-2] + (long)&pPVar2->_vptr_PromiseNode,
               OVar4.ptr);
  }
  return;
}

Assistant:

Canceler::AdapterImpl<void>::AdapterImpl(kj::PromiseFulfiller<void>& fulfiller,
            Canceler& canceler, kj::Promise<void> inner)
    : AdapterBase(canceler),
      fulfiller(fulfiller),
      inner(inner.then(
          [&fulfiller]() { fulfiller.fulfill(); },
          [&fulfiller](kj::Exception&& e) { fulfiller.reject(kj::mv(e)); })
          .eagerlyEvaluate(nullptr)) {}